

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool wallet::AddWallet(WalletContext *context,shared_ptr<wallet::CWallet> *wallet)

{
  long lVar1;
  bool bVar2;
  iterator __first;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  *in_stack_ffffffffffffff78;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 fTry;
  int in_stack_ffffffffffffff9c;
  __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
  in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffb0;
  
  fTry = (undefined1)((uint)in_stack_ffffffffffffff98 >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_RSI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (char *)in_stack_ffffffffffffffa0._M_current,in_stack_ffffffffffffff9c,(bool)fTry);
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)
                     in_stack_ffffffffffffff78);
  if (!bVar2) {
    __assert_fail("wallet",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x98,"bool wallet::AddWallet(WalletContext &, const std::shared_ptr<CWallet> &)")
    ;
  }
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::begin(in_stack_ffffffffffffff80);
  __first = std::
            vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
            ::end(in_stack_ffffffffffffff80);
  std::
  find<__gnu_cxx::__normal_iterator<std::shared_ptr<wallet::CWallet>*,std::vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>>,std::shared_ptr<wallet::CWallet>>
            ((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
              )__first._M_current,in_stack_ffffffffffffffa0,
             (shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffff80);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<wallet::CWallet>const*,std::vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>>
  ::__normal_iterator<std::shared_ptr<wallet::CWallet>*>
            ((__normal_iterator<const_std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
             (__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
              *)in_stack_ffffffffffffff80);
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::end(in_stack_ffffffffffffff80);
  bVar2 = __gnu_cxx::
          operator==<const_std::shared_ptr<wallet::CWallet>_*,_std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                    ((__normal_iterator<const_std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                     (__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                      *)in_stack_ffffffffffffff80);
  bVar2 = ((bVar2 ^ 0xffU) & 1) == 0;
  if (bVar2) {
    std::
    vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
    push_back((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
               *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
              (value_type *)in_stack_ffffffffffffff80);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff78);
    CWallet::ConnectScriptPubKeyManNotifiers(in_RDI);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff78);
    boost::signals2::
    signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
    ::operator()(in_stack_ffffffffffffff78);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool AddWallet(WalletContext& context, const std::shared_ptr<CWallet>& wallet)
{
    LOCK(context.wallets_mutex);
    assert(wallet);
    std::vector<std::shared_ptr<CWallet>>::const_iterator i = std::find(context.wallets.begin(), context.wallets.end(), wallet);
    if (i != context.wallets.end()) return false;
    context.wallets.push_back(wallet);
    wallet->ConnectScriptPubKeyManNotifiers();
    wallet->NotifyCanGetAddressesChanged();
    return true;
}